

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O3

BlockActivationObject * __thiscall
Js::BlockActivationObject::Clone(BlockActivationObject *this,ScriptContext *scriptContext)

{
  uint uVar1;
  DynamicType *type;
  int propertyId;
  DynamicObject *this_00;
  DynamicTypeHandler *pDVar2;
  Var value;
  int index;
  ulong uVar3;
  
  type = (DynamicType *)
         (this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  (*((type->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x61])();
  this_00 = (DynamicObject *)
            DynamicObject::NewObject<Js::BlockActivationObject>(scriptContext->recycler,type);
  pDVar2 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  uVar1 = pDVar2->slotCapacity;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      index = (int)uVar3;
      propertyId = (*(this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject[8])(this,uVar3);
      value = DynamicObject::GetSlot((DynamicObject *)this,index);
      DynamicObject::SetSlot(this_00,propertyId,false,index,value);
      uVar3 = (ulong)(index + 1U);
    } while (uVar1 != index + 1U);
  }
  return (BlockActivationObject *)this_00;
}

Assistant:

BlockActivationObject* BlockActivationObject::Clone(ScriptContext *scriptContext)
    {
        DynamicType* type = this->GetDynamicType();
#if ENABLE_FIXED_FIELDS
        type->GetTypeHandler()->ClearSingletonInstance(); //We are going to share the type.
#endif

        BlockActivationObject* blockScopeClone = DynamicObject::NewObject<BlockActivationObject>(scriptContext->GetRecycler(), type);
        int slotCapacity = this->GetTypeHandler()->GetSlotCapacity();

        for (int i = 0; i < slotCapacity; i += 1)
        {
            DebugOnly(PropertyId propId = this->GetPropertyId(i));
            Var value = this->GetSlot(i);
            blockScopeClone->SetSlot(SetSlotArguments(propId, i, value));
        }

        return blockScopeClone;
    }